

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O1

void __thiscall
helics::NetworkCommsInterface::PortAllocator::addUsedPort
          (PortAllocator *this,string_view host,int port)

{
  iterator iVar1;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_00;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar2;
  int local_34;
  key_type local_30;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_30._M_str = host._M_str;
  local_30._M_len = host._M_len;
  local_34 = port;
  iVar1 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::find(&(this->usedPort)._M_t,&local_30);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->usedPort)._M_t._M_impl.super__Rb_tree_header) {
    local_20._M_len = local_30._M_len;
    local_20._M_str = local_30._M_str;
    pVar2 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->hosts,&local_20);
    local_30._M_str = *(char **)(pVar2.first._M_node._M_node + 1);
    local_30._M_len = (size_t)pVar2.first._M_node._M_node[1]._M_parent;
  }
  else {
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &iVar1._M_node[1]._M_left,&local_34);
  }
  this_00 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
            std::
            map<std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            ::operator[](&this->usedPort,&local_30);
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>(this_00,&local_34);
  return;
}

Assistant:

void NetworkCommsInterface::PortAllocator::addUsedPort(std::string_view host, int port)
{
    auto hst = usedPort.find(host);
    if (hst != usedPort.end()) {
        hst->second.insert(port);
    } else {
        host = addNewHost(host);
    }
    usedPort[host].insert(port);
}